

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
StyleParser::parse_paint
          (StyleParser *this,shared_ptr<PaintServer> *paint,PaintServerMap *paint_servers)

{
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  Color local_e8 [2];
  string local_c8;
  _Self local_a8;
  _Self local_a0;
  const_iterator i;
  StringView local_88;
  undefined1 local_78 [8];
  StringView id;
  undefined1 local_60 [8];
  StringView start;
  StringView local_40;
  shared_ptr<PaintServer> local_30;
  PaintServerMap *local_20;
  PaintServerMap *paint_servers_local;
  shared_ptr<PaintServer> *paint_local;
  StyleParser *this_local;
  
  local_20 = paint_servers;
  paint_servers_local = (PaintServerMap *)paint;
  paint_local = (shared_ptr<PaintServer> *)this;
  bVar1 = Parser::parse(&this->super_Parser,"none");
  if (bVar1) {
    std::shared_ptr<PaintServer>::shared_ptr(&local_30,(nullptr_t)0x0);
    std::shared_ptr<PaintServer>::operator=
              ((shared_ptr<PaintServer> *)paint_servers_local,&local_30);
    std::shared_ptr<PaintServer>::~shared_ptr(&local_30);
  }
  else {
    bVar1 = Parser::parse(&this->super_Parser,"inherit");
    if (!bVar1) {
      bVar1 = Parser::parse(&this->super_Parser,"url");
      if (bVar1) {
        StringView::StringView(&local_40,"(");
        Parser::expect(&this->super_Parser,&local_40);
        StringView::StringView((StringView *)&start.size,"#");
        Parser::expect(&this->super_Parser,(StringView *)&start.size);
        _local_60 = Parser::get(&this->super_Parser);
        Parser::
        parse_all<StyleParser::parse_paint(std::shared_ptr<PaintServer>&,std::map<StringView,std::shared_ptr<PaintServer>,std::less<StringView>,std::allocator<std::pair<StringView_const,std::shared_ptr<PaintServer>>>>const&)::_lambda(Character)_1_>
                  (&this->super_Parser,(anon_class_1_0_00000001 *)((long)&id.size + 7));
        local_88 = Parser::get(&this->super_Parser);
        _local_78 = StringView::operator-(&local_88,(StringView *)local_60);
        StringView::StringView((StringView *)&i,")");
        Parser::expect(&this->super_Parser,(StringView *)&i);
        local_a0._M_node =
             (_Base_ptr)
             std::
             map<StringView,_std::shared_ptr<PaintServer>,_std::less<StringView>,_std::allocator<std::pair<const_StringView,_std::shared_ptr<PaintServer>_>_>_>
             ::find(local_20,(key_type *)local_78);
        local_a8._M_node =
             (_Base_ptr)
             std::
             map<StringView,_std::shared_ptr<PaintServer>,_std::less<StringView>,_std::allocator<std::pair<const_StringView,_std::shared_ptr<PaintServer>_>_>_>
             ::end(local_20);
        bVar1 = std::operator==(&local_a0,&local_a8);
        if (bVar1) {
          StringView::to_string_abi_cxx11_(&local_c8,(StringView *)local_78);
          uVar2 = std::__cxx11::string::c_str();
          printf("url not found: %s\n",uVar2);
          std::__cxx11::string::~string((string *)&local_c8);
        }
        else {
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_StringView,_std::shared_ptr<PaintServer>_>_>
                   ::operator->(&local_a0);
          std::shared_ptr<PaintServer>::operator=
                    ((shared_ptr<PaintServer> *)paint_servers_local,&ppVar3->second);
        }
      }
      else {
        parse_color(this);
        std::make_shared<ColorPaintServer,Color>(local_e8);
        std::shared_ptr<PaintServer>::operator=
                  ((shared_ptr<PaintServer> *)paint_servers_local,
                   (shared_ptr<ColorPaintServer> *)local_e8);
        std::shared_ptr<ColorPaintServer>::~shared_ptr((shared_ptr<ColorPaintServer> *)local_e8);
      }
    }
  }
  return;
}

Assistant:

void parse_paint(std::shared_ptr<PaintServer>& paint, const PaintServerMap& paint_servers) {
		if (parse("none")) {
			paint = nullptr;
		}
		else if (parse("inherit")) {

		}
		else if (parse("url")) {
			expect("(");
			expect("#");
			StringView start = get();
			parse_all([](Character c) {
				return c != ')';
			});
			StringView id = get() - start;
			expect(")");
			auto i = paint_servers.find(id);
			if (i == paint_servers.end()) {
				//error("invalid IRI: " + id.to_string());
				printf("url not found: %s\n", id.to_string().c_str());
			}
			else {
				paint = i->second;
			}
		}
		else {
			paint = std::make_shared<ColorPaintServer>(parse_color());
		}
	}